

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChPlasticityCosserat::CreatePlasticityData
          (ChPlasticityCosserat *this,int numpoints,
          vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
          *plastic_data)

{
  pointer puVar1;
  __uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
  _Var2;
  __uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
  _Var3;
  ulong uVar4;
  
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::resize(plastic_data,(long)numpoints);
  if (0 < numpoints) {
    uVar4 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
      .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl =
           (tuple<chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
            )::operator_new(0x10);
      *(undefined ***)
       _Var3._M_t.
       super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
       .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl =
           &PTR__ChBeamMaterialInternalData_00b26048;
      *(undefined8 *)
       ((long)_Var3._M_t.
              super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
              .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl
       + 8) = 0;
      puVar1 = (plastic_data->
               super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_t.
      super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
      .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl =
           puVar1[uVar4]._M_t.
           super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
           ._M_t;
      puVar1[uVar4]._M_t.
      super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
      ._M_t = _Var3._M_t.
              super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
              .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl;
      if ((_Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
            .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl !=
          (ChBeamMaterialInternalData *)0x0) {
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                              .
                              super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>
                              ._M_head_impl + 8))();
      }
      uVar4 = uVar4 + 1;
    } while ((uint)numpoints != uVar4);
  }
  return;
}

Assistant:

void ChPlasticityCosserat::CreatePlasticityData(
    int numpoints,
    std::vector<std::unique_ptr<ChBeamMaterialInternalData>>& plastic_data) {
    plastic_data.resize(numpoints);
    for (int i = 0; i < numpoints; ++i) {
        plastic_data[i] = std::unique_ptr<ChBeamMaterialInternalData>(new ChBeamMaterialInternalData());
    }
}